

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationSection.cxx
# Opt level: O0

void __thiscall cmDocumentationSection::Append(cmDocumentationSection *this,char *n,char *b)

{
  cmDocumentationEntry local_60;
  char *local_20;
  char *b_local;
  char *n_local;
  cmDocumentationSection *this_local;
  
  local_20 = b;
  b_local = n;
  n_local = (char *)this;
  cmDocumentationEntry::cmDocumentationEntry(&local_60,n,b);
  std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::push_back
            (&this->Entries,&local_60);
  cmDocumentationEntry::~cmDocumentationEntry(&local_60);
  return;
}

Assistant:

void cmDocumentationSection::Append(const char* n, const char* b)
{
  this->Entries.push_back(cmDocumentationEntry(n, b));
}